

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyDrawAttribs(DrawAttribs *Attribs)

{
  string _msg;
  string local_28;
  
  if (Attribs->NumVertices == 0) {
    FormatString<char[104]>
              (&local_28,
               (char (*) [104])
               "DrawAttribs.NumVertices is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_28._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->NumInstances == 0) {
    FormatString<char[105]>(&local_28,(char (*) [105])0x917780);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_28._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyDrawAttribs(const DrawAttribs& Attribs)
{
    if (Attribs.NumVertices == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumVertices is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    return true;
}